

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  ushort *puVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  ushort *puVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  char *pcVar14;
  char *pcVar15;
  ushort *puVar16;
  byte *pbVar17;
  byte *pbVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  byte *pbVar23;
  ushort *puVar24;
  size_t prefixSize;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  char *pcVar28;
  ushort *puVar29;
  ushort *puVar30;
  byte *pbVar31;
  byte *pbVar32;
  char *pcVar33;
  ulong uVar34;
  char *pcVar35;
  ulong uVar36;
  int iStack_50;
  
  iVar9 = (int)dest;
  iStack_50 = (int)source;
  if (dictSize == 0) {
    if (source == (char *)0x0) {
      return -1;
    }
    if (maxOutputSize == 0) {
      if (compressedSize != 1) {
        return -1;
      }
      return -(uint)(*source != '\0');
    }
    if (compressedSize == 0) {
      return -1;
    }
    puVar1 = (ushort *)(source + compressedSize);
    pbVar13 = (byte *)(dest + maxOutputSize);
    puVar24 = (ushort *)(source + (long)compressedSize + -0x10);
    pbVar26 = (byte *)dest;
    if (maxOutputSize < 0x40) goto LAB_0011e65c;
    puVar29 = (ushort *)source;
LAB_0011e188:
    do {
      source = (char *)((long)puVar29 + 1);
      bVar3 = (byte)*puVar29;
      uVar25 = (uint)bVar3;
      uVar34 = (ulong)(uint)(bVar3 >> 4);
      if (bVar3 >> 4 == 0xf) {
        if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011e691;
        puVar30 = puVar29 + 1;
        uVar22 = 0;
        puVar29 = puVar29 + 8;
        do {
          puVar16 = puVar29;
          puVar10 = (ushort *)source;
          source = (char *)((long)puVar10 + 1);
          uVar22 = uVar22 + *(byte *)((long)puVar16 + -0xf);
          puVar30 = (ushort *)((long)puVar30 + 1);
          puVar29 = (ushort *)((long)puVar16 + 1);
        } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                 *(byte *)((long)puVar16 + -0xf) == 0xff);
        uVar34 = (ulong)uVar22 + 0xf;
        pbVar31 = pbVar26 + uVar34;
        if ((CARRY8((ulong)pbVar26,uVar34)) || ((ulong)-(long)puVar30 < uVar34)) {
          source = (char *)(puVar16 + -7);
          goto LAB_0011e691;
        }
        if (dest + (long)maxOutputSize + -0x20 < pbVar31) goto LAB_0011e57b;
        puVar29 = (ushort *)((ulong)uVar22 + (long)puVar16 + 1);
        if (puVar1 + -0x10 < puVar29) {
          source = (char *)(puVar16 + -7);
          goto LAB_0011e57b;
        }
        lVar19 = 0;
        do {
          uVar6 = *(undefined8 *)((byte *)((long)source + lVar19) + 8);
          pbVar17 = pbVar26 + lVar19;
          *(undefined8 *)pbVar17 = *(undefined8 *)((long)source + lVar19);
          *(undefined8 *)(pbVar17 + 8) = uVar6;
          pbVar11 = (byte *)((long)puVar10 + lVar19 + 0x11);
          uVar6 = *(undefined8 *)(pbVar11 + 8);
          *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar11;
          *(undefined8 *)(pbVar17 + 0x18) = uVar6;
          lVar19 = lVar19 + 0x20;
        } while (pbVar17 + 0x20 < pbVar31);
      }
      else {
        pbVar31 = pbVar26 + uVar34;
        if ((ushort *)((long)puVar1 - 0x11U) < source) goto LAB_0011e57b;
        uVar6 = *(undefined8 *)((long)puVar29 + 9);
        *(undefined8 *)pbVar26 = *(undefined8 *)source;
        *(undefined8 *)(pbVar26 + 8) = uVar6;
        puVar29 = (ushort *)(uVar34 + (long)source);
      }
      uVar5 = *puVar29;
      uVar36 = (ulong)uVar5;
      source = (char *)(puVar29 + 1);
      pbVar17 = pbVar31 + -uVar36;
      uVar27 = (ulong)(bVar3 & 0xf);
      if (uVar27 == 0xf) {
        if (pbVar17 < dest) goto LAB_0011e691;
        uVar25 = 0;
        puVar29 = (ushort *)source;
        do {
          source = (char *)((long)puVar29 + 1);
          if (puVar1 + -2 <= source) goto LAB_0011e691;
          uVar7 = *puVar29;
          uVar25 = uVar25 + (byte)uVar7;
          puVar29 = (ushort *)source;
        } while ((byte)uVar7 == 0xff);
        uVar34 = (ulong)uVar25;
        if ((byte *)(-0x10 - uVar34) < pbVar31) goto LAB_0011e691;
        uVar27 = uVar34 + 0x13;
        if (pbVar13 + -0x40 <= pbVar31 + uVar34 + 0x13) goto LAB_0011e5fd;
      }
      else {
        pbVar26 = pbVar31 + uVar27 + 4;
        uVar27 = uVar27 + 4;
        if (pbVar13 + -0x40 <= pbVar26) goto LAB_0011e5fd;
        if ((dest <= pbVar17) && (7 < uVar5)) {
          *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
          *(undefined8 *)(pbVar31 + 8) = *(undefined8 *)(pbVar17 + 8);
          *(undefined2 *)(pbVar31 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
          puVar29 = (ushort *)source;
          goto LAB_0011e188;
        }
      }
      if (pbVar17 < dest) goto LAB_0011e691;
      pbVar26 = pbVar31 + uVar27;
      puVar29 = (ushort *)source;
      if (uVar5 < 0x10) {
        if (uVar36 == 4) {
          iVar8 = *(int *)pbVar17;
        }
        else if (uVar5 == 2) {
          iVar8 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
        }
        else {
          if (uVar5 != 1) {
            if (uVar5 < 8) {
              pbVar31[0] = 0;
              pbVar31[1] = 0;
              pbVar31[2] = 0;
              pbVar31[3] = 0;
              *pbVar31 = *pbVar17;
              pbVar31[1] = pbVar17[1];
              pbVar31[2] = pbVar17[2];
              pbVar31[3] = pbVar17[3];
              uVar25 = inc32table[uVar5];
              *(undefined4 *)(pbVar31 + 4) = *(undefined4 *)(pbVar17 + uVar25);
              pbVar17 = pbVar17 + ((ulong)uVar25 - (long)dec64table[uVar5]);
            }
            else {
              *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
              pbVar17 = pbVar17 + 8;
            }
            pbVar31 = pbVar31 + 8;
            do {
              *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
              pbVar31 = pbVar31 + 8;
              pbVar17 = pbVar17 + 8;
            } while (pbVar31 < pbVar26);
            goto LAB_0011e188;
          }
          iVar8 = (uint)*pbVar17 * 0x1010101;
        }
        *(int *)pbVar31 = iVar8;
        *(int *)(pbVar31 + 4) = iVar8;
        if (8 < uVar27) {
          pbVar31 = pbVar31 + 8;
          do {
            *(int *)pbVar31 = iVar8;
            *(int *)(pbVar31 + 4) = iVar8;
            pbVar31 = pbVar31 + 8;
          } while (pbVar31 < pbVar26);
        }
        goto LAB_0011e188;
      }
      do {
        uVar6 = *(undefined8 *)(pbVar31 + -uVar36 + 8);
        *(undefined8 *)pbVar31 = *(undefined8 *)(pbVar31 + -uVar36);
        *(undefined8 *)(pbVar31 + 8) = uVar6;
        uVar6 = *(undefined8 *)(pbVar31 + -uVar36 + 0x10 + 8);
        *(undefined8 *)(pbVar31 + 0x10) = *(undefined8 *)(pbVar31 + -uVar36 + 0x10);
        *(undefined8 *)(pbVar31 + 0x18) = uVar6;
        pbVar31 = pbVar31 + 0x20;
      } while (pbVar31 < pbVar26);
    } while( true );
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize == dest) {
    if (dictSize < 0xffff) {
      iVar9 = LZ4_decompress_safe_withSmallPrefix
                        (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar9;
    }
    iVar8 = -1;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar8 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar1 = (ushort *)(source + compressedSize);
        lVar19 = (long)maxOutputSize;
        puVar24 = (ushort *)(source + (long)compressedSize + -0x10);
        if (0x3f < maxOutputSize) {
          lVar21 = 0;
          puVar29 = (ushort *)source;
LAB_0011eebc:
          do {
            pcVar33 = dest + lVar21;
            source = (char *)((long)puVar29 + 1);
            bVar3 = (byte)*puVar29;
            uVar25 = (uint)bVar3;
            uVar34 = (ulong)(uint)(bVar3 >> 4);
            if (bVar3 >> 4 == 0xf) {
              if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011f3e0;
              puVar30 = puVar29 + 1;
              uVar22 = 0;
              puVar29 = puVar29 + 8;
              do {
                puVar16 = puVar29;
                puVar10 = (ushort *)source;
                source = (char *)((long)puVar10 + 1);
                uVar22 = uVar22 + *(byte *)((long)puVar16 + -0xf);
                puVar30 = (ushort *)((long)puVar30 + 1);
                puVar29 = (ushort *)((long)puVar16 + 1);
              } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                       *(byte *)((long)puVar16 + -0xf) == 0xff);
              uVar34 = (ulong)uVar22 + 0xf;
              if ((CARRY8((ulong)pcVar33,uVar34)) || ((ulong)-(long)puVar30 < uVar34)) {
                source = (char *)(puVar16 + -7);
                goto LAB_0011f3e0;
              }
              lVar20 = lVar21 + uVar34;
              if (dest + lVar19 + -0x20 < dest + lVar20) goto LAB_0011f2b0;
              puVar29 = (ushort *)((ulong)uVar22 + (long)puVar16 + 1);
              if (puVar1 + -0x10 < puVar29) {
                source = (char *)(puVar16 + -7);
                goto LAB_0011f2b0;
              }
              lVar21 = 0;
              do {
                uVar6 = *(undefined8 *)((byte *)((long)source + lVar21) + 8);
                pcVar2 = pcVar33 + lVar21;
                *(undefined8 *)pcVar2 = *(undefined8 *)((long)source + lVar21);
                *(undefined8 *)(pcVar2 + 8) = uVar6;
                pbVar13 = (byte *)((long)puVar10 + lVar21 + 0x11);
                uVar6 = *(undefined8 *)(pbVar13 + 8);
                *(undefined8 *)(pcVar2 + 0x10) = *(undefined8 *)pbVar13;
                *(undefined8 *)(pcVar2 + 0x18) = uVar6;
                lVar21 = lVar21 + 0x20;
              } while (pcVar2 + 0x20 < dest + lVar20);
            }
            else {
              lVar20 = lVar21 + uVar34;
              if ((ushort *)((long)puVar1 - 0x11U) < source) goto LAB_0011f2b0;
              uVar6 = *(undefined8 *)((long)puVar29 + 9);
              *(undefined8 *)pcVar33 = *(undefined8 *)source;
              *(undefined8 *)(pcVar33 + 8) = uVar6;
              puVar29 = (ushort *)(uVar34 + (long)source);
            }
            pbVar13 = (byte *)(dest + lVar20);
            uVar5 = *puVar29;
            uVar34 = (ulong)uVar5;
            uVar22 = (uint)uVar5;
            source = (char *)(puVar29 + 1);
            lVar12 = lVar20 - uVar34;
            pbVar26 = (byte *)(dest + lVar12);
            uVar27 = (ulong)(bVar3 & 0xf);
            if (uVar27 == 0xf) {
              if (lVar12 < -0x10000) goto LAB_0011f3e0;
              uVar25 = 0;
              puVar29 = (ushort *)source;
              do {
                source = (char *)((long)puVar29 + 1);
                if (puVar1 + -2 <= source) goto LAB_0011f3e0;
                uVar7 = *puVar29;
                uVar25 = uVar25 + (byte)uVar7;
                puVar29 = (ushort *)source;
              } while ((byte)uVar7 == 0xff);
              uVar36 = (ulong)uVar25;
              if ((byte *)(-0x10 - uVar36) < pbVar13) goto LAB_0011f3e0;
              uVar27 = uVar36 + 0x13;
              if (dest + lVar19 + -0x40 <= pbVar13 + uVar36 + 0x13) goto LAB_0011f33a;
            }
            else {
              lVar21 = uVar27 + lVar20 + 4;
              uVar27 = uVar27 + 4;
              if (dest + lVar19 + -0x40 <= dest + lVar21) goto LAB_0011f33a;
              if (7 < uVar5) {
                *(undefined8 *)pbVar13 = *(undefined8 *)pbVar26;
                *(undefined8 *)(pbVar13 + 8) = *(undefined8 *)(pbVar26 + 8);
                *(undefined2 *)(pbVar13 + 0x10) = *(undefined2 *)(pbVar26 + 0x10);
                puVar29 = (ushort *)source;
                goto LAB_0011eebc;
              }
            }
            if (lVar12 < -0x10000) goto LAB_0011f3e0;
            lVar21 = uVar27 + lVar20;
            pbVar31 = (byte *)(dest + lVar21);
            puVar29 = (ushort *)source;
            if (uVar5 < 0x10) {
              if (uVar34 == 4) {
                iVar8 = *(int *)pbVar26;
              }
              else if (uVar5 == 2) {
                iVar8 = CONCAT22(*(undefined2 *)pbVar26,*(undefined2 *)pbVar26);
              }
              else {
                if (uVar5 != 1) {
                  if (uVar5 < 8) {
                    pbVar13[0] = 0;
                    pbVar13[1] = 0;
                    pbVar13[2] = 0;
                    pbVar13[3] = 0;
                    *pbVar13 = *pbVar26;
                    pbVar13[1] = pbVar26[1];
                    pbVar13[2] = pbVar26[2];
                    pbVar13[3] = pbVar26[3];
                    uVar25 = inc32table[uVar5];
                    *(undefined4 *)(pbVar13 + 4) = *(undefined4 *)(pbVar26 + uVar25);
                    pbVar26 = pbVar26 + ((ulong)uVar25 - (long)dec64table[uVar5]);
                  }
                  else {
                    *(undefined8 *)pbVar13 = *(undefined8 *)pbVar26;
                    pbVar26 = pbVar26 + 8;
                  }
                  pbVar13 = pbVar13 + 8;
                  do {
                    *(undefined8 *)pbVar13 = *(undefined8 *)pbVar26;
                    pbVar13 = pbVar13 + 8;
                    pbVar26 = pbVar26 + 8;
                  } while (pbVar13 < pbVar31);
                  goto LAB_0011eebc;
                }
                iVar8 = (uint)*pbVar26 * 0x1010101;
              }
              do {
                *(int *)pbVar13 = iVar8;
                *(int *)(pbVar13 + 4) = iVar8;
                pbVar13 = pbVar13 + 8;
              } while (pbVar13 < pbVar31);
              goto LAB_0011eebc;
            }
            do {
              uVar6 = *(undefined8 *)(pbVar13 + -uVar34 + 8);
              *(undefined8 *)pbVar13 = *(undefined8 *)(pbVar13 + -uVar34);
              *(undefined8 *)(pbVar13 + 8) = uVar6;
              uVar6 = *(undefined8 *)(pbVar13 + -uVar34 + 0x10 + 8);
              *(undefined8 *)(pbVar13 + 0x10) = *(undefined8 *)(pbVar13 + -uVar34 + 0x10);
              *(undefined8 *)(pbVar13 + 0x18) = uVar6;
              pbVar13 = pbVar13 + 0x20;
            } while (pbVar13 < pbVar31);
          } while( true );
        }
        lVar21 = 0;
LAB_0011f3a4:
        bVar3 = (byte)*(ushort *)source;
        source = (char *)((long)source + 1);
        lVar20 = lVar21;
        while( true ) {
          pcVar33 = dest + lVar20;
          uVar25 = (uint)bVar3;
          if (bVar3 >> 4 == 0xf) break;
          uVar34 = (ulong)(uint)(bVar3 >> 4);
          if ((puVar24 <= source) || (dest + lVar19 + -0x20 < pcVar33)) goto LAB_0011f2ad;
          uVar6 = *(undefined8 *)((long)source + 8);
          *(undefined8 *)pcVar33 = *(undefined8 *)source;
          *(undefined8 *)(pcVar33 + 8) = uVar6;
          lVar20 = lVar21 + uVar34;
          uVar27 = (ulong)(uVar25 & 0xf);
          puVar30 = (ushort *)((long)source + uVar34) + 1;
          uVar5 = *(ushort *)((long)source + uVar34);
          uVar22 = (uint)uVar5;
          lVar12 = lVar20 - (ulong)uVar5;
          if (((uVar25 & 0xf) == 0xf) || (uVar5 < 8)) goto LAB_0011f2f8;
          *(undefined8 *)(dest + lVar20) = *(undefined8 *)(dest + lVar12);
          *(undefined8 *)(dest + lVar20 + 8) = *(undefined8 *)(dest + lVar12 + 8);
          *(undefined2 *)(dest + lVar20 + 0x10) = *(undefined2 *)(dest + lVar12 + 0x10);
          lVar21 = lVar20 + uVar27 + 4;
          lVar20 = uVar27 + lVar20 + 4;
          bVar3 = *(byte *)((long)source + uVar34 + 2);
          source = (char *)((long)source + uVar34 + 3);
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011f3e0;
        pbVar13 = (byte *)((long)source + 1);
        uVar22 = 0;
        do {
          uVar5 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar22 = uVar22 + (byte)uVar5;
          pbVar13 = pbVar13 + 1;
        } while (source < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
        uVar34 = (ulong)uVar22 + 0xf;
        if ((CARRY8((ulong)pcVar33,uVar34)) || ((ulong)-(long)pbVar13 < uVar34)) goto LAB_0011f3e0;
LAB_0011f2ad:
        lVar20 = lVar21 + uVar34;
LAB_0011f2b0:
        puVar29 = (ushort *)((long)source + uVar34);
        if ((dest + lVar20 <= dest + lVar19 + -0xc) && (puVar29 <= puVar1 + -4)) {
          do {
            *(undefined8 *)pcVar33 = *(undefined8 *)source;
            pcVar33 = pcVar33 + 8;
            source = (char *)((long)source + 8);
          } while (pcVar33 < dest + lVar20);
          uVar22 = (uint)*puVar29;
          puVar30 = puVar29 + 1;
          lVar12 = lVar20 - (ulong)*puVar29;
          uVar27 = (ulong)(uVar25 & 0xf);
LAB_0011f2f8:
          source = (char *)puVar30;
          if ((int)uVar27 == 0xf) {
            uVar25 = 0;
            do {
              puVar29 = puVar30;
              source = (char *)((long)puVar29 + 1);
              if (puVar1 + -2 <= source) goto LAB_0011f3dd;
              uVar25 = uVar25 + (byte)*puVar29;
              puVar30 = (ushort *)source;
            } while ((byte)*puVar29 == 0xff);
            uVar27 = (ulong)uVar25 + 0xf;
            if (CARRY8((ulong)(dest + lVar20),uVar27)) {
LAB_0011f3dd:
              source = (char *)((long)puVar29 + 1);
              goto LAB_0011f3e0;
            }
          }
          uVar27 = uVar27 + 4;
LAB_0011f33a:
          if (lVar12 < -0x10000) goto LAB_0011f3e0;
          pcVar33 = dest + lVar20;
          pcVar14 = dest + lVar12;
          lVar21 = lVar20 + uVar27;
          pcVar2 = dest + lVar21;
          if (uVar22 < 8) {
            pcVar33[0] = '\0';
            pcVar33[1] = '\0';
            pcVar33[2] = '\0';
            pcVar33[3] = '\0';
            *pcVar33 = *pcVar14;
            pcVar33[1] = pcVar14[1];
            pcVar33[2] = pcVar14[2];
            pcVar33[3] = pcVar14[3];
            uVar34 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar22 << 2));
            *(undefined4 *)(pcVar33 + 4) = *(undefined4 *)(pcVar14 + uVar34);
            pcVar14 = pcVar14 + (uVar34 - (long)*(int *)((long)dec64table + (ulong)(uVar22 << 2)));
          }
          else {
            *(undefined8 *)pcVar33 = *(undefined8 *)pcVar14;
            pcVar14 = pcVar14 + 8;
          }
          pcVar15 = pcVar33 + 8;
          if (dest + lVar19 + -0xc < pcVar2) {
            if (dest + lVar19 + -5 < pcVar2) goto LAB_0011f3e0;
            pcVar33 = dest + lVar19 + -7;
            pcVar28 = pcVar14;
            pcVar35 = pcVar15;
            if (pcVar15 < pcVar33) {
              do {
                *(undefined8 *)pcVar35 = *(undefined8 *)pcVar28;
                pcVar35 = pcVar35 + 8;
                pcVar28 = pcVar28 + 8;
              } while (pcVar35 < pcVar33);
              pcVar14 = pcVar14 + ((long)pcVar33 - (long)pcVar15);
              pcVar15 = pcVar33;
            }
            for (; pcVar15 < pcVar2; pcVar15 = pcVar15 + 1) {
              cVar4 = *pcVar14;
              pcVar14 = pcVar14 + 1;
              *pcVar15 = cVar4;
            }
          }
          else {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar14;
            if (0x10 < uVar27) {
              pcVar33 = pcVar33 + 0x10;
              do {
                pcVar14 = pcVar14 + 8;
                *(undefined8 *)pcVar33 = *(undefined8 *)pcVar14;
                pcVar33 = pcVar33 + 8;
              } while (pcVar33 < pcVar2);
            }
          }
          goto LAB_0011f3a4;
        }
        if ((puVar29 == puVar1) && (lVar20 <= lVar19)) {
          memmove(pcVar33,source,uVar34);
          return ((int)pcVar33 + (int)uVar34) - iVar9;
        }
LAB_0011f3e0:
        iVar8 = ~(uint)source + iStack_50;
      }
    }
    return iVar8;
  }
  if (source == (char *)0x0) {
    return -1;
  }
  pcVar33 = dictStart + prefixSize;
  if (dictStart == (char *)0x0) {
    pcVar33 = (char *)0x0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar1 = (ushort *)(source + compressedSize);
  pbVar13 = (byte *)(dest + maxOutputSize);
  puVar24 = (ushort *)(source + (long)compressedSize + -0x10);
  pbVar26 = (byte *)dest;
  if (maxOutputSize < 0x40) goto LAB_0011fbe7;
  puVar29 = (ushort *)source;
LAB_0011f563:
  source = (char *)((long)puVar29 + 1);
  bVar3 = (byte)*puVar29;
  uVar25 = (uint)bVar3;
  uVar34 = (ulong)(uint)(bVar3 >> 4);
  if (bVar3 >> 4 == 0xf) {
    if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011fc46;
    puVar30 = puVar29 + 1;
    uVar22 = 0;
    puVar29 = puVar29 + 8;
    do {
      puVar16 = puVar29;
      puVar10 = (ushort *)source;
      source = (char *)((long)puVar10 + 1);
      uVar22 = uVar22 + *(byte *)((long)puVar16 + -0xf);
      puVar30 = (ushort *)((long)puVar30 + 1);
      puVar29 = (ushort *)((long)puVar16 + 1);
    } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
             *(byte *)((long)puVar16 + -0xf) == 0xff);
    uVar34 = (ulong)uVar22 + 0xf;
    pbVar31 = pbVar26 + uVar34;
    if ((CARRY8((ulong)pbVar26,uVar34)) || ((ulong)-(long)puVar30 < uVar34)) {
      source = (char *)(puVar16 + -7);
      goto LAB_0011fc46;
    }
    if (dest + (long)maxOutputSize + -0x20 < pbVar31) goto LAB_0011fa2d;
    puVar29 = (ushort *)((ulong)uVar22 + (long)puVar16 + 1);
    if (puVar1 + -0x10 < puVar29) {
      source = (char *)(puVar16 + -7);
      goto LAB_0011fa2d;
    }
    lVar19 = 0;
    do {
      uVar6 = *(undefined8 *)((byte *)((long)source + lVar19) + 8);
      pbVar17 = pbVar26 + lVar19;
      *(undefined8 *)pbVar17 = *(undefined8 *)((long)source + lVar19);
      *(undefined8 *)(pbVar17 + 8) = uVar6;
      pbVar11 = (byte *)((long)puVar10 + lVar19 + 0x11);
      uVar6 = *(undefined8 *)(pbVar11 + 8);
      *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar11;
      *(undefined8 *)(pbVar17 + 0x18) = uVar6;
      lVar19 = lVar19 + 0x20;
    } while (pbVar17 + 0x20 < pbVar31);
  }
  else {
    pbVar31 = pbVar26 + uVar34;
    if ((ushort *)((long)puVar1 - 0x11U) < source) goto LAB_0011fa2d;
    uVar6 = *(undefined8 *)((long)puVar29 + 9);
    *(undefined8 *)pbVar26 = *(undefined8 *)source;
    *(undefined8 *)(pbVar26 + 8) = uVar6;
    puVar29 = (ushort *)(uVar34 + (long)source);
  }
  uVar5 = *puVar29;
  uVar27 = (ulong)uVar5;
  source = (char *)(puVar29 + 1);
  pbVar17 = pbVar31 + -uVar27;
  uVar34 = (ulong)(bVar3 & 0xf);
  if (uVar34 == 0xf) {
    if ((prefixSize < 0x10000) && (pbVar17 + prefixSize < dest)) goto LAB_0011fc46;
    uVar25 = 0;
    puVar29 = (ushort *)source;
    do {
      source = (char *)((long)puVar29 + 1);
      if (puVar1 + -2 <= source) goto LAB_0011fc46;
      uVar7 = *puVar29;
      uVar25 = uVar25 + (byte)uVar7;
      puVar29 = (ushort *)source;
    } while ((byte)uVar7 == 0xff);
    uVar34 = (ulong)uVar25;
    if ((byte *)(-0x10 - uVar34) < pbVar31) goto LAB_0011fc46;
    uVar36 = uVar34 + 0x13;
    if (pbVar13 + -0x40 <= pbVar31 + uVar34 + 0x13) goto LAB_0011fab9;
  }
  else {
    uVar36 = uVar34 + 4;
    if (pbVar13 + -0x40 <= pbVar31 + uVar34 + 4) goto LAB_0011fab9;
    if ((dest <= pbVar17) && (7 < uVar5)) {
      *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
      *(undefined8 *)(pbVar31 + 8) = *(undefined8 *)(pbVar17 + 8);
      *(undefined2 *)(pbVar31 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
      pbVar26 = pbVar31 + uVar34 + 4;
      puVar29 = (ushort *)source;
      goto LAB_0011f563;
    }
  }
  if ((prefixSize < 0x10000) && (pbVar17 + prefixSize < dest)) goto LAB_0011fc46;
  pbVar11 = pbVar31 + uVar36;
  pbVar26 = pbVar11;
  puVar29 = (ushort *)source;
  if (pbVar17 < dest) {
    if (pbVar13 + -5 < pbVar11) goto LAB_0011fc46;
    uVar34 = (long)dest - (long)pbVar17;
    uVar27 = uVar36 - uVar34;
    if (uVar36 < uVar34 || uVar27 == 0) {
      memmove(pbVar31,pcVar33 + -uVar34,uVar36);
    }
    else {
      memcpy(pbVar31,pcVar33 + -uVar34,uVar34);
      pbVar26 = pbVar31 + uVar34;
      if ((ulong)((long)pbVar26 - (long)dest) < uVar27) {
        pbVar31 = (byte *)dest;
        if (uVar34 < uVar36) {
          do {
            *pbVar26 = *pbVar31;
            pbVar26 = pbVar26 + 1;
            pbVar31 = pbVar31 + 1;
          } while (pbVar26 < pbVar11);
        }
      }
      else {
        memcpy(pbVar26,dest,uVar27);
        pbVar26 = pbVar11;
      }
    }
  }
  else {
    if (uVar5 < 0x10) {
      if (uVar27 == 4) {
        iVar8 = *(int *)pbVar17;
      }
      else if (uVar5 == 2) {
        iVar8 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
      }
      else {
        if (uVar5 != 1) {
          if (uVar5 < 8) {
            pbVar31[0] = 0;
            pbVar31[1] = 0;
            pbVar31[2] = 0;
            pbVar31[3] = 0;
            *pbVar31 = *pbVar17;
            pbVar31[1] = pbVar17[1];
            pbVar31[2] = pbVar17[2];
            pbVar31[3] = pbVar17[3];
            uVar25 = inc32table[uVar5];
            *(undefined4 *)(pbVar31 + 4) = *(undefined4 *)(pbVar17 + uVar25);
            pbVar17 = pbVar17 + ((ulong)uVar25 - (long)dec64table[uVar5]);
          }
          else {
            *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
            pbVar17 = pbVar17 + 8;
          }
          pbVar31 = pbVar31 + 8;
          do {
            *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
            pbVar31 = pbVar31 + 8;
            pbVar17 = pbVar17 + 8;
          } while (pbVar31 < pbVar11);
          goto LAB_0011f563;
        }
        iVar8 = (uint)*pbVar17 * 0x1010101;
      }
      *(int *)pbVar31 = iVar8;
      *(int *)(pbVar31 + 4) = iVar8;
      if (8 < uVar36) {
        pbVar31 = pbVar31 + 8;
        do {
          *(int *)pbVar31 = iVar8;
          *(int *)(pbVar31 + 4) = iVar8;
          pbVar31 = pbVar31 + 8;
        } while (pbVar31 < pbVar11);
      }
      goto LAB_0011f563;
    }
    do {
      uVar6 = *(undefined8 *)(pbVar31 + -uVar27 + 8);
      *(undefined8 *)pbVar31 = *(undefined8 *)(pbVar31 + -uVar27);
      *(undefined8 *)(pbVar31 + 8) = uVar6;
      uVar6 = *(undefined8 *)(pbVar31 + -uVar27 + 0x10 + 8);
      *(undefined8 *)(pbVar31 + 0x10) = *(undefined8 *)(pbVar31 + -uVar27 + 0x10);
      *(undefined8 *)(pbVar31 + 0x18) = uVar6;
      pbVar31 = pbVar31 + 0x20;
    } while (pbVar31 < pbVar11);
  }
  goto LAB_0011f563;
LAB_0011e5fd:
  if (pbVar17 < dest) {
LAB_0011e691:
    return ~(uint)source + iStack_50;
  }
  pbVar26 = pbVar31 + uVar27;
  if ((uint)uVar36 < 8) {
    pbVar31[0] = 0;
    pbVar31[1] = 0;
    pbVar31[2] = 0;
    pbVar31[3] = 0;
    *pbVar31 = *pbVar17;
    pbVar31[1] = pbVar17[1];
    pbVar31[2] = pbVar17[2];
    pbVar31[3] = pbVar17[3];
    uVar34 = (ulong)((uint)uVar36 << 2);
    uVar36 = (ulong)*(uint *)((long)inc32table + uVar34);
    *(undefined4 *)(pbVar31 + 4) = *(undefined4 *)(pbVar17 + uVar36);
    pbVar17 = pbVar17 + (uVar36 - (long)*(int *)((long)dec64table + uVar34));
  }
  else {
    *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
    pbVar17 = pbVar17 + 8;
  }
  pbVar11 = pbVar31 + 8;
  if (pbVar13 + -0xc < pbVar26) {
    if (pbVar13 + -5 < pbVar26) goto LAB_0011e691;
    pbVar31 = pbVar13 + -7;
    pbVar18 = pbVar17;
    pbVar32 = pbVar11;
    if (pbVar11 < pbVar31) {
      do {
        *(undefined8 *)pbVar32 = *(undefined8 *)pbVar18;
        pbVar32 = pbVar32 + 8;
        pbVar18 = pbVar18 + 8;
      } while (pbVar32 < pbVar31);
      pbVar17 = pbVar17 + ((long)pbVar31 - (long)pbVar11);
      pbVar11 = pbVar31;
    }
    for (; pbVar11 < pbVar26; pbVar11 = pbVar11 + 1) {
      bVar3 = *pbVar17;
      pbVar17 = pbVar17 + 1;
      *pbVar11 = bVar3;
    }
  }
  else {
    *(undefined8 *)pbVar11 = *(undefined8 *)pbVar17;
    if (0x10 < uVar27) {
      pbVar31 = pbVar31 + 0x10;
      do {
        pbVar17 = pbVar17 + 8;
        *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
        pbVar31 = pbVar31 + 8;
      } while (pbVar31 < pbVar26);
    }
  }
LAB_0011e65c:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar25 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uVar34 = (ulong)(uint)(bVar3 >> 4);
    if ((puVar24 <= source) || (dest + (long)maxOutputSize + -0x20 < pbVar26)) goto LAB_0011e575;
    uVar6 = *(undefined8 *)((long)source + 8);
    *(undefined8 *)pbVar26 = *(undefined8 *)source;
    *(undefined8 *)(pbVar26 + 8) = uVar6;
    pbVar31 = pbVar26 + uVar34;
    uVar27 = (ulong)(uVar25 & 0xf);
    puVar29 = (ushort *)((long)source + uVar34) + 1;
    uVar5 = *(ushort *)((long)source + uVar34);
    uVar36 = (ulong)uVar5;
    pbVar17 = pbVar31 + -uVar36;
    if ((((uVar25 & 0xf) == 0xf) || (uVar5 < 8)) || (pbVar17 < dest)) goto LAB_0011e5bd;
    *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
    *(undefined8 *)(pbVar31 + 8) = *(undefined8 *)(pbVar17 + 8);
    *(undefined2 *)(pbVar31 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
    pbVar26 = pbVar31 + uVar27 + 4;
    bVar3 = *(byte *)((long)source + uVar34 + 2);
    source = (char *)((long)source + uVar34 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011e691;
  pbVar31 = (byte *)((long)source + 1);
  uVar22 = 0;
  do {
    uVar5 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar22 = uVar22 + (byte)uVar5;
    pbVar31 = pbVar31 + 1;
  } while (source < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar34 = (ulong)uVar22 + 0xf;
  if ((CARRY8((ulong)pbVar26,uVar34)) || ((ulong)-(long)pbVar31 < uVar34)) goto LAB_0011e691;
LAB_0011e575:
  pbVar31 = pbVar26 + uVar34;
LAB_0011e57b:
  puVar29 = (ushort *)((long)source + uVar34);
  if ((pbVar13 + -0xc < pbVar31) || (puVar1 + -4 < puVar29)) {
    if ((puVar29 == puVar1) && (pbVar31 <= pbVar13)) {
      memmove(pbVar26,source,uVar34);
      return ((int)pbVar26 + (int)uVar34) - iVar9;
    }
    goto LAB_0011e691;
  }
  do {
    *(undefined8 *)pbVar26 = *(undefined8 *)source;
    pbVar26 = pbVar26 + 8;
    source = (char *)((long)source + 8);
  } while (pbVar26 < pbVar31);
  uVar36 = (ulong)*puVar29;
  puVar29 = puVar29 + 1;
  pbVar17 = pbVar31 + -uVar36;
  uVar27 = (ulong)(uVar25 & 0xf);
LAB_0011e5bd:
  source = (char *)puVar29;
  if ((int)uVar27 == 0xf) {
    uVar25 = 0;
    do {
      puVar30 = puVar29;
      source = (char *)((long)puVar30 + 1);
      if (puVar1 + -2 <= source) goto LAB_0011e68e;
      uVar25 = uVar25 + (byte)*puVar30;
      puVar29 = (ushort *)source;
    } while ((byte)*puVar30 == 0xff);
    uVar27 = (ulong)uVar25 + 0xf;
    if (CARRY8((ulong)pbVar31,uVar27)) {
LAB_0011e68e:
      source = (char *)((long)puVar30 + 1);
      goto LAB_0011e691;
    }
  }
  uVar27 = uVar27 + 4;
  goto LAB_0011e5fd;
LAB_0011fab9:
  if ((prefixSize < 0x10000) && (pbVar17 + prefixSize < dest)) goto LAB_0011fc46;
  pbVar11 = pbVar31 + uVar36;
  pbVar26 = pbVar11;
  if (pbVar17 < dest) {
    if (pbVar13 + -5 < pbVar11) goto LAB_0011fc46;
    uVar34 = (long)dest - (long)pbVar17;
    uVar27 = uVar36 - uVar34;
    if (uVar36 < uVar34 || uVar27 == 0) {
      memmove(pbVar31,pcVar33 + -uVar34,uVar36);
    }
    else {
      memcpy(pbVar31,pcVar33 + -uVar34,uVar34);
      pbVar26 = pbVar31 + uVar34;
      if ((ulong)((long)pbVar26 - (long)dest) < uVar27) {
        pbVar31 = (byte *)dest;
        if (uVar34 < uVar36) {
          do {
            *pbVar26 = *pbVar31;
            pbVar26 = pbVar26 + 1;
            pbVar31 = pbVar31 + 1;
          } while (pbVar26 < pbVar11);
        }
      }
      else {
        memcpy(pbVar26,dest,uVar27);
        pbVar26 = pbVar11;
      }
    }
  }
  else {
    if ((uint)uVar27 < 8) {
      pbVar31[0] = 0;
      pbVar31[1] = 0;
      pbVar31[2] = 0;
      pbVar31[3] = 0;
      *pbVar31 = *pbVar17;
      pbVar31[1] = pbVar17[1];
      pbVar31[2] = pbVar17[2];
      pbVar31[3] = pbVar17[3];
      uVar34 = (ulong)((uint)uVar27 << 2);
      uVar27 = (ulong)*(uint *)((long)inc32table + uVar34);
      *(undefined4 *)(pbVar31 + 4) = *(undefined4 *)(pbVar17 + uVar27);
      pbVar17 = pbVar17 + (uVar27 - (long)*(int *)((long)dec64table + uVar34));
    }
    else {
      *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
      pbVar17 = pbVar17 + 8;
    }
    pbVar18 = pbVar31 + 8;
    if (pbVar13 + -0xc < pbVar11) {
      if (pbVar13 + -5 < pbVar11) goto LAB_0011fc46;
      pbVar31 = pbVar13 + -7;
      pbVar32 = pbVar17;
      pbVar23 = pbVar18;
      if (pbVar18 < pbVar31) {
        do {
          *(undefined8 *)pbVar23 = *(undefined8 *)pbVar32;
          pbVar23 = pbVar23 + 8;
          pbVar32 = pbVar32 + 8;
        } while (pbVar23 < pbVar31);
        pbVar17 = pbVar17 + ((long)pbVar31 - (long)pbVar18);
        pbVar18 = pbVar31;
      }
      for (; pbVar18 < pbVar11; pbVar18 = pbVar18 + 1) {
        bVar3 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        *pbVar18 = bVar3;
      }
    }
    else {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar17;
      if (0x10 < uVar36) {
        pbVar31 = pbVar31 + 0x10;
        do {
          pbVar17 = pbVar17 + 8;
          *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
          pbVar31 = pbVar31 + 8;
        } while (pbVar31 < pbVar11);
      }
    }
  }
LAB_0011fbe7:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar25 = (uint)bVar3;
    if (bVar3 >> 4 == 0xf) break;
    uVar34 = (ulong)(uint)(bVar3 >> 4);
    if ((puVar24 <= source) || (dest + (long)maxOutputSize + -0x20 < pbVar26)) goto LAB_0011fa29;
    uVar6 = *(undefined8 *)((long)source + 8);
    *(undefined8 *)pbVar26 = *(undefined8 *)source;
    *(undefined8 *)(pbVar26 + 8) = uVar6;
    pbVar31 = pbVar26 + uVar34;
    uVar36 = (ulong)(uVar25 & 0xf);
    puVar29 = (ushort *)((long)source + uVar34);
    uVar27 = (ulong)*puVar29;
    pbVar17 = pbVar31 + -uVar27;
    if ((((uVar25 & 0xf) == 0xf) || (*puVar29 < 8)) || (pbVar17 < dest)) goto LAB_0011fa72;
    *(undefined8 *)pbVar31 = *(undefined8 *)pbVar17;
    *(undefined8 *)(pbVar31 + 8) = *(undefined8 *)(pbVar17 + 8);
    *(undefined2 *)(pbVar31 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
    pbVar26 = pbVar31 + uVar36 + 4;
    bVar3 = *(byte *)((long)source + uVar34 + 2);
    source = (char *)((long)source + uVar34 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= source) goto LAB_0011fc46;
  pbVar31 = (byte *)((long)source + 1);
  uVar34 = 0;
  do {
    uVar5 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar34 = (ulong)((int)uVar34 + (uint)(byte)uVar5);
    pbVar31 = pbVar31 + 1;
  } while (source < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar34 = uVar34 + 0xf;
  if ((CARRY8((ulong)pbVar26,uVar34)) || ((ulong)-(long)pbVar31 < uVar34)) goto LAB_0011fc46;
LAB_0011fa29:
  pbVar31 = pbVar26 + uVar34;
LAB_0011fa2d:
  puVar29 = (ushort *)((long)source + uVar34);
  if ((pbVar13 + -0xc < pbVar31) || (puVar1 + -4 < puVar29)) {
    if ((puVar29 == puVar1) && (pbVar31 <= pbVar13)) {
      memmove(pbVar26,source,uVar34);
      return ((int)pbVar26 + (int)uVar34) - iVar9;
    }
    goto LAB_0011fc46;
  }
  do {
    *(undefined8 *)pbVar26 = *(undefined8 *)source;
    pbVar26 = pbVar26 + 8;
    source = (char *)((long)source + 8);
  } while (pbVar26 < pbVar31);
  uVar27 = (ulong)*puVar29;
  pbVar17 = pbVar31 + -uVar27;
  uVar36 = (ulong)(uVar25 & 0xf);
LAB_0011fa72:
  source = (char *)(puVar29 + 1);
  if ((int)uVar36 == 0xf) {
    uVar25 = 0;
    do {
      puVar29 = (ushort *)source;
      source = (char *)((long)puVar29 + 1);
      if (puVar1 + -2 <= source) goto LAB_0011fc43;
      uVar25 = uVar25 + (byte)*puVar29;
    } while ((byte)*puVar29 == 0xff);
    uVar36 = (ulong)uVar25 + 0xf;
    if (CARRY8((ulong)pbVar31,uVar36)) {
LAB_0011fc43:
      source = (char *)((long)puVar29 + 1);
LAB_0011fc46:
      return ~(uint)source + iStack_50;
    }
  }
  uVar36 = uVar36 + 4;
  goto LAB_0011fab9;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}